

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

bool __thiscall
CFG::findVariable(CFG *this,string *var,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *productionTo)

{
  pointer ppPVar1;
  pointer ppPVar2;
  bool bVar3;
  pointer ppPVar4;
  
  ppPVar1 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppPVar2 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    ppPVar4 = ppPVar2;
    if (ppPVar4 == ppPVar1) goto LAB_00122224;
    bVar3 = std::operator==(&(*ppPVar4)->toP,productionTo);
    ppPVar2 = ppPVar4 + 1;
  } while (!bVar3);
  std::__cxx11::string::_M_assign((string *)var);
LAB_00122224:
  return ppPVar4 != ppPVar1;
}

Assistant:

bool CFG::findVariable(std::string &var, std::vector<std::string> productionTo) {
    for (Production *production: productionsP) {
        if (production->getToP() == productionTo) {
            var = production->getFromP();
            return true;
        }
    }
    return false;
}